

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSignal_POSIX.c
# Opt level: O0

UINT8 OSSignal_Wait(OS_SIGNAL *sig)

{
  int iVar1;
  int local_1c;
  int retVal;
  OS_SIGNAL *sig_local;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)sig);
  if (iVar1 == 0) {
    local_1c = 0;
    while (sig->state == '\0' && local_1c == 0) {
      local_1c = pthread_cond_wait((pthread_cond_t *)&sig->hCond,(pthread_mutex_t *)sig);
    }
    sig->state = '\0';
    pthread_mutex_unlock((pthread_mutex_t *)sig);
    sig_local._7_1_ = '\0';
    if (local_1c != 0) {
      sig_local._7_1_ = 0xff;
    }
  }
  else {
    sig_local._7_1_ = 0xff;
  }
  return sig_local._7_1_;
}

Assistant:

UINT8 OSSignal_Wait(OS_SIGNAL* sig)
{
	int retVal;
	
	retVal = pthread_mutex_lock(&sig->hMutex);
	if (retVal)
		return 0xFF;
	
	while(! sig->state && ! retVal)
		retVal = pthread_cond_wait(&sig->hCond, &sig->hMutex);
	sig->state = 0;	// reset signal after catching it successfully
	
	pthread_mutex_unlock(&sig->hMutex);
	return retVal ? 0xFF : 0x00;
}